

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NS_derive.cpp
# Opt level: O1

void derive_functions::der_vel_avg
               (Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,Geometry *param_6,
               Real param_7,int *param_8,int level)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  int iVar31;
  bool bVar32;
  ulong uVar33;
  ulong uVar34;
  double dVar35;
  long local_108;
  
  pdVar15 = (datfab->super_BaseFab<double>).dptr;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar7 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar28 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar5) + 1);
  lVar26 = (((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar6) + 1) * lVar28;
  lVar29 = (((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar7) + 1) * lVar26;
  pdVar16 = (derfab->super_BaseFab<double>).dptr;
  dVar1 = NavierStokesBase::time_avg.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[level];
  dVar2 = NavierStokesBase::time_avg_fluct.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[level];
  iVar8 = (bx->smallend).vect[0];
  iVar9 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar19 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar25 = (((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1) * lVar19;
  lVar20 = (((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar9) + 1) * lVar25;
  uVar33 = -(ulong)(dVar1 == 0.0);
  uVar34 = -(ulong)(dVar2 == 0.0);
  iVar10 = (bx->smallend).vect[1];
  iVar11 = (bx->smallend).vect[2];
  iVar12 = (bx->bigend).vect[0];
  iVar13 = (bx->bigend).vect[1];
  iVar14 = (bx->bigend).vect[2];
  local_108 = 0;
  do {
    if (iVar11 <= iVar14) {
      iVar17 = iVar11;
      do {
        if (iVar10 <= iVar13) {
          lVar21 = (iVar17 - iVar9) * lVar25;
          lVar22 = (iVar17 - iVar7) * lVar26;
          iVar18 = iVar10;
          do {
            if (iVar8 <= iVar12) {
              lVar23 = (iVar18 - iVar4) * lVar19;
              lVar24 = (iVar18 - iVar6) * lVar28;
              iVar31 = iVar8 - iVar3;
              iVar27 = iVar8 - iVar5;
              iVar30 = (iVar12 - iVar8) + 1;
              do {
                pdVar16[dcomp * lVar29 + lVar22 + lVar24 + (long)iVar27 + local_108 * lVar29] =
                     pdVar15[lVar21 + lVar23 + (long)iVar31 + local_108 * lVar20] *
                     (double)(uVar33 & 0x3ff0000000000000 | ~uVar33 & (ulong)(1.0 / dVar1));
                dVar35 = pdVar15[lVar21 + lVar23 + (long)iVar31 + (local_108 + 3) * lVar20] *
                         (double)(uVar34 & 0x3ff0000000000000 | ~uVar34 & (ulong)(1.0 / dVar2));
                if (dVar35 < 0.0) {
                  dVar35 = sqrt(dVar35);
                }
                else {
                  dVar35 = SQRT(dVar35);
                }
                pdVar16[dcomp * lVar29 + lVar22 + lVar24 + (long)iVar27 + (local_108 + 3) * lVar29]
                     = dVar35;
                iVar27 = iVar27 + 1;
                iVar31 = iVar31 + 1;
                iVar30 = iVar30 + -1;
              } while (iVar30 != 0);
            }
            bVar32 = iVar18 != iVar13;
            iVar18 = iVar18 + 1;
          } while (bVar32);
        }
        bVar32 = iVar17 != iVar14;
        iVar17 = iVar17 + 1;
      } while (bVar32);
    }
    local_108 = local_108 + 1;
  } while (local_108 != 3);
  return;
}

Assistant:

void der_vel_avg (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
		    const FArrayBox& datfab, const Geometry& /*geomdata*/,
		    Real /*time*/, const int* /*bcrec*/, int level)

  {
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= AMREX_SPACEDIM*2);
    AMREX_ASSERT(ncomp == AMREX_SPACEDIM*2);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
    amrex::Real inv_time;
    amrex::Real inv_time_fluct;

    if (NavierStokesBase::time_avg[level] == 0){
      inv_time = 1.0;
    }else{
      inv_time = 1.0 / NavierStokesBase::time_avg[level];
    }

    if (NavierStokesBase::time_avg_fluct[level] == 0){
      inv_time_fluct = 1.0;
    }else{
      inv_time_fluct = 1.0 / NavierStokesBase::time_avg_fluct[level];
    }

    amrex::ParallelFor(bx, AMREX_SPACEDIM, [inv_time,inv_time_fluct,der,in_dat]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        der(i,j,k,n) = in_dat(i,j,k,n) * inv_time;
        der(i,j,k,n+AMREX_SPACEDIM) = sqrt(in_dat(i,j,k,n+AMREX_SPACEDIM) * inv_time_fluct);
    });
  }